

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O3

size_t nivalis::OpCode::n_args(uint32_t opcode)

{
  ulong uVar1;
  
  if (opcode < 0x33) {
    uVar1 = (ulong)opcode;
    if ((0x7000301000100U >> (uVar1 & 0x3f) & 1) != 0) {
      return 2;
    }
    if ((0x20fUL >> (uVar1 & 0x3f) & 1) != 0) {
      return 0;
    }
    if ((0x70000UL >> (uVar1 & 0x3f) & 1) != 0) {
      return 3;
    }
  }
  if (((0x25 < opcode - 0x40) || ((0x3f001f0003U >> ((ulong)(opcode - 0x40) & 0x3f) & 1) == 0)) &&
     (6 < opcode - 0x4000)) {
    return 1;
  }
  return 2;
}

Assistant:

size_t n_args(uint32_t opcode) {
    using namespace nivalis::OpCode; switch(opcode) {
        case OpCode::null: case val: case ref:
        case thunk_jmp: case arg:
            return 0;
        case bsel: case add: case sub: case mul: case divi: case mod:
        case power: case logbase: case max: case min:
        case land: case lor: case lxor:
        case gcd: case lcm:
        case choose: case fafact: case rifact: case betab: case polygammab:
        case lt: case le: case eq: case ne: case ge: case gt:
        case thunk_ret:
            return 2;
        case sums: case prods: case bnz:
            return 3;
        // case call: return -1;
    }
    return 1;
}